

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedPrimitiveFieldGenerator::GenerateByteSize
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type type;
  int iVar2;
  int fixed_size;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"{\n");
  io::Printer::Indent(printer);
  type = FieldDescriptor::type(this->descriptor_);
  iVar2 = anon_unknown_3::FixedSize(type);
  if (iVar2 == -1) {
    io::Printer::Print(printer,&this->variables_,
                       "size_t data_size = ::google::protobuf::internal::WireFormatLite::\n  $declared_type$Size(this->$name$_);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "unsigned int count = this->$name$_size();\nsize_t data_size = $fixed_size$UL * count;\n"
                      );
  }
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (data_size > 0) {\n  total_size += $tag_size$ +\n    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n}\nint cached_size = ::google::protobuf::internal::ToCachedSize(data_size);\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_$name$_cached_byte_size_ = cached_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\ntotal_size += data_size;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "total_size += $tag_size$ *\n              ::google::protobuf::internal::FromIntSize(this->$name$_size());\ntotal_size += data_size;\n"
                      );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_, "{\n");
  printer->Indent();
  int fixed_size = FixedSize(descriptor_->type());
  if (fixed_size == -1) {
    printer->Print(variables_,
      "size_t data_size = ::google::protobuf::internal::WireFormatLite::\n"
      "  $declared_type$Size(this->$name$_);\n");
  } else {
    printer->Print(variables_,
      "unsigned int count = this->$name$_size();\n"
      "size_t data_size = $fixed_size$UL * count;\n");
  }

  if (descriptor_->is_packed()) {
    printer->Print(variables_,
      "if (data_size > 0) {\n"
      "  total_size += $tag_size$ +\n"
      "    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n"
      "}\n"
      "int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "_$name$_cached_byte_size_ = cached_size;\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "total_size += data_size;\n");
  } else {
    printer->Print(variables_,
      "total_size += $tag_size$ *\n"
      "              ::google::protobuf::internal::FromIntSize(this->$name$_size());\n"
      "total_size += data_size;\n");
  }
  printer->Outdent();
  printer->Print("}\n");
}